

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool __thiscall
r_comp::Compiler::read_string
          (Compiler *this,Ptr *node,bool enforce,Class *p,uint16_t write_index,
          uint16_t *extent_index,bool write)

{
  ushort uVar1;
  ImageObject *pIVar2;
  byte bVar3;
  uint16_t *extent_index_00;
  uint16_t write_index_00;
  bool bVar4;
  uint uVar5;
  State SVar6;
  ulong uVar7;
  element_type *peVar8;
  char *pcVar9;
  Atom *pAVar10;
  shared_ptr<r_comp::RepliStruct> local_188;
  allocator local_171;
  string local_170 [36];
  State local_14c;
  shared_ptr<r_comp::RepliStruct> local_148;
  State local_138;
  Atom local_134 [4];
  State s;
  ushort local_12c;
  byte local_129;
  uint16_t i;
  int8_t shift;
  uint64_t _st;
  Atom local_118 [6];
  ushort local_112;
  string local_110 [6];
  uint16_t l;
  string str;
  shared_ptr<r_comp::RepliStruct> local_f0;
  shared_ptr<r_comp::RepliStruct> local_e0;
  shared_ptr<r_comp::RepliStruct> local_d0;
  Class local_c0;
  shared_ptr<r_comp::RepliStruct> local_78 [2];
  shared_ptr<r_comp::RepliStruct> local_58;
  byte local_41;
  uint16_t *puStack_40;
  bool write_local;
  uint16_t *extent_index_local;
  Class *pCStack_30;
  uint16_t write_index_local;
  Class *p_local;
  Ptr *pPStack_20;
  bool enforce_local;
  Ptr *node_local;
  Compiler *this_local;
  
  local_41 = write;
  puStack_40 = extent_index;
  extent_index_local._6_2_ = write_index;
  pCStack_30 = p;
  p_local._7_1_ = enforce;
  pPStack_20 = node;
  node_local = (Ptr *)this;
  std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_58,node);
  bVar4 = read_nil_st(this,&local_58,extent_index_local._6_2_,puStack_40,(bool)(local_41 & 1));
  std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_58);
  if (bVar4) {
    this_local._7_1_ = true;
  }
  else {
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr(local_78,node);
    write_index_00 = extent_index_local._6_2_;
    extent_index_00 = puStack_40;
    bVar3 = local_41;
    Class::Class(&local_c0,STRING);
    bVar4 = read_variable(this,local_78,write_index_00,extent_index_00,(bool)(bVar3 & 1),&local_c0);
    Class::~Class(&local_c0);
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(local_78);
    if (bVar4) {
      this_local._7_1_ = true;
    }
    else {
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_d0,node);
      bVar4 = read_reference(this,&local_d0,extent_index_local._6_2_,puStack_40,(bool)(local_41 & 1)
                             ,STRING);
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_d0);
      if (bVar4) {
        this_local._7_1_ = true;
      }
      else {
        std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_e0,node);
        bVar4 = read_wildcard(this,&local_e0,extent_index_local._6_2_,puStack_40,
                              (bool)(local_41 & 1));
        std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_e0);
        if (bVar4) {
          this_local._7_1_ = true;
        }
        else {
          std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_f0,node);
          bVar4 = read_tail_wildcard(this,&local_f0,extent_index_local._6_2_,puStack_40,
                                     (bool)(local_41 & 1));
          std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_f0);
          if (bVar4) {
            this_local._7_1_ = true;
          }
          else {
            std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)node);
            uVar7 = std::__cxx11::string::size();
            if (2 < uVar7) {
              peVar8 = std::
                       __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)node);
              pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)&peVar8->cmd);
              if (*pcVar9 == '\"') {
                peVar8 = std::
                         __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)node);
                std::
                __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)node);
                std::__cxx11::string::length();
                pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)&peVar8->cmd);
                if (*pcVar9 == '\"') {
                  if ((local_41 & 1) != 0) {
                    peVar8 = std::
                             __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)node);
                    std::
                    __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)node);
                    std::__cxx11::string::size();
                    std::__cxx11::string::substr((ulong)local_110,(ulong)&peVar8->cmd);
                    local_112 = std::__cxx11::string::length();
                    r_code::Atom::IPointer((ushort)local_118);
                    pAVar10 = r_code::vector<r_code::Atom>::operator[]
                                        ((vector<r_code::Atom> *)(this->current_object + 8),
                                         (ulong)extent_index_local._6_2_);
                    r_code::Atom::operator=(pAVar10,local_118);
                    r_code::Atom::~Atom(local_118);
                    r_code::Atom::String((char)&_st + '\x04');
                    pIVar2 = this->current_object;
                    uVar1 = *puStack_40;
                    *puStack_40 = uVar1 + 1;
                    pAVar10 = r_code::vector<r_code::Atom>::operator[]
                                        ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
                    r_code::Atom::operator=(pAVar10,(Atom *)((long)&_st + 4));
                    r_code::Atom::~Atom((Atom *)((long)&_st + 4));
                    uVar5 = 0;
                    local_129 = 0;
                    for (local_12c = 0; local_12c < local_112; local_12c = local_12c + 1) {
                      pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)local_110);
                      uVar5 = (int)*pcVar9 << (local_129 & 0x1f) | uVar5;
                      local_129 = local_129 + 8;
                      if (local_129 == 0x20) {
                        r_code::Atom::Atom((Atom *)&s,uVar5);
                        pIVar2 = this->current_object;
                        uVar1 = *puStack_40;
                        *puStack_40 = uVar1 + 1;
                        pAVar10 = r_code::vector<r_code::Atom>::operator[]
                                            ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
                        r_code::Atom::operator=(pAVar10,(Atom *)&s);
                        r_code::Atom::~Atom((Atom *)&s);
                        uVar5 = 0;
                        local_129 = 0;
                      }
                    }
                    if ((uint)local_112 % 4 != 0) {
                      r_code::Atom::Atom(local_134,uVar5);
                      pIVar2 = this->current_object;
                      uVar1 = *puStack_40;
                      *puStack_40 = uVar1 + 1;
                      pAVar10 = r_code::vector<r_code::Atom>::operator[]
                                          ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
                      r_code::Atom::operator=(pAVar10,local_134);
                      r_code::Atom::~Atom(local_134);
                    }
                    std::__cxx11::string::~string(local_110);
                  }
                  return true;
                }
              }
            }
            SVar6 = save_state(this);
            local_138._0_3_ = SVar6._0_3_;
            std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_148,node);
            bVar4 = expression(this,&local_148,STRING,extent_index_local._6_2_,puStack_40,
                               (bool)(local_41 & 1));
            std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_148);
            if (bVar4) {
              this_local._7_1_ = true;
            }
            else {
              local_14c = local_138;
              restore_state(this,local_138);
              if ((p_local._7_1_ & 1) == 0) {
                this_local._7_1_ = false;
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_170," error: expected a string",&local_171);
                std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_188,node);
                set_error(this,(string *)local_170,&local_188);
                std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_188);
                std::__cxx11::string::~string(local_170);
                std::allocator<char>::~allocator((allocator<char> *)&local_171);
                this_local._7_1_ = false;
              }
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::read_string(RepliStruct::Ptr node, bool enforce, const Class *p, uint16_t write_index, uint16_t &extent_index, bool write) // p always NULL
{
    if (read_nil_st(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_variable(node, write_index, extent_index, write, STRING)) {
        return true;
    }

    if (read_reference(node, write_index, extent_index, write, STRING)) {
        return true;
    }

    if (read_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_tail_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (node->cmd.size() > 2 && node->cmd[0] == '"' && node->cmd[node->cmd.length() - 1] == '"') {
        if (write) {
            std::string str = node->cmd.substr(1, node->cmd.size() - 2);
            uint16_t l = (uint16_t)str.length(); // TODO: check string length
            current_object->code[write_index] = Atom::IPointer(extent_index);
            current_object->code[extent_index++] = Atom::String(l);
            uint64_t _st = 0;
            int8_t shift = 0;

            for (uint16_t i = 0; i < l; ++i) {
                _st |= str[i] << shift;
                shift += 8;

                if (shift == 32) {
                    current_object->code[extent_index++] = _st;
                    _st = 0;
                    shift = 0;
                }
            }

            if (l % 4) {
                current_object->code[extent_index++] = _st;
            }
        }

        return true;
    }

    State s = save_state();

    if (expression(node, STRING, write_index, extent_index, write)) {
        return true;
    }

    restore_state(s);

    if (enforce) {
        set_error(" error: expected a string", node);
        return false;
    }

    return false;
}